

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::toDimacs(Solver *this,FILE *f,vec<Glucose::Lit> *assumps)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  FILE *__stream;
  bool bVar4;
  Var VVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  int x;
  long lVar9;
  Clause *c;
  Var max;
  vec<int> map;
  uint local_50;
  uint local_4c;
  vec<int> local_48;
  FILE *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_48.data = (int *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  local_50 = 0;
  lVar7 = (long)(this->clauses).sz;
  local_38 = (FILE *)f;
  if (lVar7 < 1) {
    local_4c = 0;
  }
  else {
    puVar2 = (this->clauses).data;
    puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    lVar9 = 0;
    iVar8 = 0;
    do {
      bVar4 = satisfied(this,(Clause *)(puVar3 + puVar2[lVar9]));
      iVar8 = iVar8 + (uint)!bVar4;
      lVar9 = lVar9 + 1;
      local_4c = iVar8;
    } while (lVar7 != lVar9);
  }
  if (0 < (this->clauses).sz) {
    lVar7 = 0;
    do {
      c = (Clause *)
          ((this->ca).super_RegionAllocator<unsigned_int>.memory + (this->clauses).data[lVar7]);
      bVar4 = satisfied(this,c);
      if ((!bVar4) && (0 < *(int *)&(c->header).field_0x4)) {
        lVar9 = 0;
        do {
          iVar8 = *(int *)(&c[1].header.field_0x0 + lVar9 * 4);
          x = iVar8 >> 1;
          if (((byte)iVar8 & 1 ^ (this->assigns).data[x].value) != 1) {
            mapVar(x,&local_48,(Var *)&local_50);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)&(c->header).field_0x4);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->clauses).sz);
  }
  __stream = local_38;
  local_4c = local_4c + (this->assumptions).sz;
  fprintf(local_38,"p cnf %d %d\n",(ulong)local_50);
  if (0 < (this->assumptions).sz) {
    lVar7 = 0;
    do {
      uVar1 = (this->assumptions).data[lVar7].x;
      VVar5 = mapVar((int)uVar1 >> 1,&local_48,(Var *)&local_50);
      pcVar6 = "-";
      if ((uVar1 & 1) == 0) {
        pcVar6 = "";
      }
      fprintf(__stream,"%s%d 0\n",pcVar6,(ulong)(VVar5 + 1));
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->assumptions).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar7 = 0;
    do {
      toDimacs(this,(FILE *)__stream,
               (Clause *)
               ((this->ca).super_RegionAllocator<unsigned_int>.memory + (this->clauses).data[lVar7])
               ,&local_48,(Var *)&local_50);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("Wrote %d clauses with %d variables.\n",(ulong)local_4c,(ulong)local_50);
  }
  if (local_48.data != (int *)0x0) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    free(local_48.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE *f, const vec <Lit> &assumps) {
    // Handle case when solver is in contradictory state:
    if(!ok) {
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return;
    }

    vec <Var> map;
    Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for(int i = 0; i < clauses.size(); i++)
        if(!satisfied(ca[clauses[i]]))
            cnt++;

    for(int i = 0; i < clauses.size(); i++)
        if(!satisfied(ca[clauses[i]])) {
            Clause &c = ca[clauses[i]];
            for(int j = 0; j < c.size(); j++)
                if(value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for(int i = 0; i < assumptions.size(); i++) {
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max) + 1);
    }

    for(int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if(verbosity > 0)
        printf("Wrote %d clauses with %d variables.\n", cnt, max);
}